

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O3

StatusOr<bool> * __thiscall
draco::PlyReader::ParseEndHeader
          (StatusOr<bool> *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  long lVar1;
  array<char,_10UL> c;
  long *local_70;
  long local_68;
  long local_60 [2];
  long local_50;
  short local_48;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  parser::SkipWhitespace(buffer);
  lVar1 = buffer->pos_;
  if (buffer->data_size_ < lVar1 + 10) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"End of file reached before the end_header","");
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_40,local_38 + (long)local_40);
    (__return_storage_ptr__->status_).code_ = INVALID_PARAMETER;
    (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->status_).error_msg_,local_70,
               local_68 + (long)local_70);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  else {
    local_50 = *(long *)(buffer->data_ + lVar1);
    local_48 = *(short *)(buffer->data_ + lVar1 + 8);
    if (local_48 == 0x7265 && local_50 == 0x646165685f646e65) {
      parser::SkipLine(buffer);
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = true;
    }
    else {
      (__return_storage_ptr__->status_).code_ = OK;
      (__return_storage_ptr__->status_).error_msg_._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->status_).error_msg_.field_2;
      (__return_storage_ptr__->status_).error_msg_._M_string_length = 0;
      (__return_storage_ptr__->status_).error_msg_.field_2._M_local_buf[0] = '\0';
      __return_storage_ptr__->value_ = false;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

StatusOr<bool> PlyReader::ParseEndHeader(DecoderBuffer *buffer) {
  parser::SkipWhitespace(buffer);
  std::array<char, 10> c;
  if (!buffer->Peek(&c)) {
    return Status(Status::INVALID_PARAMETER,
                  "End of file reached before the end_header");
  }
  if (std::memcmp(&c[0], "end_header", 10) != 0) {
    return false;
  }
  parser::SkipLine(buffer);
  return true;
}